

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O0

int ffi1fi4(uchar *input,long ntodo,double scale,double zero,int *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  int *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  uchar *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      dVar1 = ((double)input[(long)dvalue] - zero) / scale;
      if (-2147483648.49 <= dVar1) {
        if (dVar1 <= 2147483647.49) {
          if (dVar1 < 0.0) {
            output[(long)dvalue] = (int)(dVar1 - 0.5);
          }
          else {
            output[(long)dvalue] = (int)(dVar1 + 0.5);
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        output[(long)dvalue] = -0x80000000;
      }
    }
  }
  else {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      output[(long)dvalue] = (uint)input[(long)dvalue];
    }
  }
  return *status;
}

Assistant:

int ffi1fi4(unsigned char *input,  /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,      /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (INT32BIT) input[ii];   /* copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (((double) input[ii]) - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}